

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestStart
          (PrettyUnitTestResultPrinter *this,TestInfo *test_info)

{
  ColoredPrintf(COLOR_GREEN,"[ RUN      ] ");
  printf("%s.%s",(this->test_case_name_).c_str_,(test_info->name_)._M_dataplus._M_p);
  putchar(10);
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestStart(const TestInfo& test_info) {
  ColoredPrintf(COLOR_GREEN,  "[ RUN      ] ");
  PrintTestName(test_case_name_.c_str(), test_info.name());
  printf("\n");
  fflush(stdout);
}